

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  if ((font != (ImFont *)0x0) && (pIVar1 = font->ContainerAtlas, pIVar1 != (ImFontAtlas *)0x0)) {
    fVar3 = font->Scale;
    fVar4 = 0.0;
    if (0.0 < fVar3) {
      GImGui->Font = font;
      fVar3 = fVar3 * (pIVar2->IO).FontGlobalScale * font->FontSize;
      pIVar2->FontBaseSize = fVar3;
      if (pIVar2->CurrentWindow != (ImGuiWindow *)0x0) {
        fVar4 = fVar3 * pIVar2->CurrentWindow->FontWindowScale;
      }
      pIVar2->FontSize = fVar4;
      pIVar2->FontTexUvWhitePixel = pIVar1->TexUvWhitePixel;
      return;
    }
    __assert_fail("font->Scale > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x11e7,"void SetCurrentFont(ImFont *)");
  }
  __assert_fail("font && font->IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x11e6,"void SetCurrentFont(ImFont *)");
}

Assistant:

static void SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale;
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;
    g.FontTexUvWhitePixel = g.Font->ContainerAtlas->TexUvWhitePixel;
}